

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int secure_random_init(void)

{
  int iVar1;
  
  iVar1 = 0;
  if (secure_random_data_0 == '\0') {
    secure_random_data_1 = fopen("/dev/urandom","rb");
    if (secure_random_data_1 == (FILE *)0x0) {
      iVar1 = 1;
    }
    else {
      secure_random_data_0 = '\x01';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int secure_random_init()
{
	if(secure_random_data.initialized)
	{
		return 0;
	}
#if defined(CONF_FAMILY_WINDOWS)
	if(CryptAcquireContext(&secure_random_data.provider, NULL, NULL, PROV_RSA_FULL, CRYPT_VERIFYCONTEXT))
	{
		secure_random_data.initialized = 1;
		return 0;
	}
	else
	{
		return 1;
	}
#else
	secure_random_data.urandom = io_open("/dev/urandom", IOFLAG_READ);
	if(secure_random_data.urandom)
	{
		secure_random_data.initialized = 1;
		return 0;
	}
	else
	{
		return 1;
	}
#endif
}